

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,MessageLite *extendee,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint16_t uVar1;
  anon_class_32_4_5f7794cc func;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  uint8_t *local_70;
  _Base_ptr local_68;
  MessageLite *pMStack_60;
  EpsCopyOutputStream *local_58;
  ExtensionSet *pEStack_50;
  anon_class_32_4_5f7794cc local_48;
  
  local_68 = (_Base_ptr)&local_70;
  uVar1 = this->flat_size_;
  pKVar2 = (this->map_).flat;
  pMStack_60 = extendee;
  local_58 = stream;
  pEStack_50 = this;
  if ((long)(short)uVar1 < 0) {
    func.extendee = extendee;
    func.target = (uint8_t **)local_68;
    func.stream = stream;
    func.extension_set = this;
    local_70 = target;
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0>
              (&local_48,(ExtensionSet *)(pKVar2->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar2->second,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )local_68,func);
    target = local_70;
  }
  else if (uVar1 != 0) {
    pKVar3 = pKVar2 + (short)uVar1;
    local_70 = target;
    do {
      target = Extension::InternalSerializeMessageSetItemWithCachedSizesToArray
                         (&pKVar2->second,extendee,this,pKVar2->first,local_70,stream);
      pKVar2 = pKVar2 + 1;
      local_70 = target;
    } while (pKVar2 != pKVar3);
  }
  return target;
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    const MessageLite* extendee, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const ExtensionSet* extension_set = this;
  ForEach([&target, extendee, stream, extension_set](int number,
                                                     const Extension& ext) {
    target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
        extendee, extension_set, number, target, stream);
  });
  return target;
}